

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O2

void av1_compute_stats_sse4_1
               (int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,int use_downsampled_wiener_stats)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int32_t (*paiVar13) [7];
  int32_t (*paiVar14) [56];
  int32_t *piVar15;
  int iVar16;
  long lVar17;
  int64_t (*paiVar18) [7];
  int64_t (*paiVar19) [56];
  int64_t *piVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  undefined1 *puVar25;
  int64_t *piVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  int64_t *piVar31;
  int32_t (*paiVar32) [7];
  int32_t *piVar33;
  int64_t *piVar34;
  long lVar35;
  undefined1 *puVar36;
  uint8_t *puVar37;
  uint8_t *puVar38;
  int64_t *piVar39;
  long lVar40;
  uint8_t *puVar41;
  uint8_t *puVar42;
  undefined1 auVar43 [16];
  uint8_t *local_b208;
  undefined1 *local_b1f8;
  int64_t *local_b148;
  __m128i kl;
  longlong local_b0b8 [3];
  int64_t *local_b0a0;
  uint8_t *local_b098;
  uint8_t *local_b090;
  undefined1 local_b088 [16];
  undefined1 local_b078 [16];
  undefined1 local_b068 [16];
  undefined1 local_b058 [16];
  undefined1 local_b048 [16];
  undefined1 local_b038 [16];
  undefined4 local_b028;
  undefined1 local_afb8 [16];
  undefined1 local_afa8 [16];
  undefined1 local_af98 [16];
  undefined1 local_af88 [16];
  undefined1 local_af78 [16];
  undefined1 local_af68 [16];
  undefined4 local_af58;
  int32_t sumY [7] [7];
  int32_t M_int32 [7] [7];
  int64_t M_int64 [7] [7];
  undefined1 local_abb8 [10976];
  int32_t H_int32 [49] [56];
  int64_t H_int64 [49] [56];
  
  local_b148 = H;
  local_b0a0 = M;
  lVar11 = (long)dgd_stride;
  if (wiener_win == 5) {
    bVar5 = find_average(dgd,h_start,h_end,v_start,v_end,dgd_stride);
    M_int32[2][6] = 0;
    M_int32[3][0] = 0;
    M_int32[3][1] = 0;
    M_int32[3][2] = 0;
    M_int32[2][2] = 0;
    M_int32[2][3] = 0;
    M_int32[2][4] = 0;
    M_int32[2][5] = 0;
    M_int32[1][5] = 0;
    M_int32[1][6] = 0;
    M_int32[2][0] = 0;
    M_int32[2][1] = 0;
    M_int32[1][1] = 0;
    M_int32[1][2] = 0;
    M_int32[1][3] = 0;
    M_int32[1][4] = 0;
    M_int32[0][4] = 0;
    M_int32[0][5] = 0;
    M_int32[0][6] = 0;
    M_int32[1][0] = 0;
    M_int32[0][0] = 0;
    M_int32[0][1] = 0;
    M_int32[0][2] = 0;
    M_int32[0][3] = 0;
    M_int32[3][3] = 0;
    iVar29 = 0;
    memset(M_int64,0,200);
    memset(H_int32,0,4000);
    memset(H_int64,0,8000);
    sumY[2][6] = 0;
    sumY[3][0] = 0;
    sumY[3][1] = 0;
    sumY[3][2] = 0;
    sumY[2][2] = 0;
    sumY[2][3] = 0;
    sumY[2][4] = 0;
    sumY[2][5] = 0;
    sumY[1][5] = 0;
    sumY[1][6] = 0;
    sumY[2][0] = 0;
    sumY[2][1] = 0;
    sumY[1][1] = 0;
    sumY[1][2] = 0;
    sumY[1][3] = 0;
    sumY[1][4] = 0;
    sumY[3][3] = 0;
    sumY[0][4] = 0;
    sumY[0][5] = 0;
    sumY[0][6] = 0;
    sumY[1][0] = 0;
    sumY[0][0] = 0;
    sumY[0][1] = 0;
    sumY[0][2] = 0;
    sumY[0][3] = 0;
    uVar23 = (ulong)(dgd_stride * 2);
    iVar24 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
    local_b0b8[0] = 0x403030202010100;
    local_b0b8[1] = 0x807070606050504;
    for (iVar10 = v_start; iVar16 = v_end - iVar10, iVar16 != 0 && iVar10 <= v_end;
        iVar10 = iVar10 + 0x40) {
      if (0x3f < iVar16) {
        iVar16 = 0x40;
      }
      iVar28 = iVar10;
      while( true ) {
        iVar7 = (iVar16 + iVar10) - iVar28;
        if (iVar7 == 0 || iVar16 + iVar10 < iVar28) break;
        local_b038 = (undefined1  [16])0x0;
        local_b048 = (undefined1  [16])0x0;
        local_b058 = (undefined1  [16])0x0;
        local_b068 = (undefined1  [16])0x0;
        local_b078 = (undefined1  [16])0x0;
        local_b088 = (undefined1  [16])0x0;
        local_b028 = 0;
        local_afb8 = (undefined1  [16])0x0;
        local_afa8 = (undefined1  [16])0x0;
        local_af98 = (undefined1  [16])0x0;
        local_af88 = (undefined1  [16])0x0;
        local_af78 = (undefined1  [16])0x0;
        local_af68 = (undefined1  [16])0x0;
        local_af58 = 0;
        iVar8 = 0;
        memset(local_abb8,0,4000);
        lVar22 = (long)(iVar28 * dgd_stride) + (-2 - uVar23);
        iVar27 = iVar28 * src_stride;
        puVar37 = dgd + (long)(iVar28 * dgd_stride) + ~uVar23 + (long)h_start;
        iVar21 = h_start;
        for (lVar17 = (long)h_start; lVar17 < (int)(h_end & 0xfffffffe); lVar17 = lVar17 + 2) {
          puVar41 = dgd + lVar17 + lVar22;
          bVar1 = src[lVar17 + iVar27];
          bVar2 = src[lVar17 + (long)iVar27 + 1];
          puVar25 = local_abb8;
          local_b208 = local_b088;
          local_b1f8 = local_afb8;
          puVar38 = puVar37;
          for (lVar40 = 0; lVar40 != 5; lVar40 = lVar40 + 1) {
            lVar12 = 0;
            for (lVar35 = 0; lVar35 != 4000; lVar35 = lVar35 + 800) {
              bVar3 = puVar38[lVar12 + -1];
              bVar4 = puVar38[lVar12];
              *(uint *)(local_b208 + lVar12 * 4) =
                   *(int *)(local_b208 + lVar12 * 4) + (uint)bVar4 + (uint)bVar3;
              *(uint *)(local_b1f8 + lVar12 * 4) =
                   *(int *)(local_b1f8 + lVar12 * 4) +
                   (uint)bVar4 * (uint)bVar2 + (uint)bVar3 * (uint)bVar1;
              auVar43 = pshuflw(ZEXT216(*(ushort *)(puVar38 + lVar12 + -1)),
                                ZEXT216(*(ushort *)(puVar38 + lVar12 + -1)),0);
              kl = (__m128i)pmovzxbw(auVar43,auVar43);
              acc_stat_sse41((int32_t *)(puVar25 + lVar35),puVar41,(__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar35 + 0x20),puVar41 + lVar11,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar35 + 0x40),puVar41 + uVar23,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar35 + 0x60),puVar41 + dgd_stride * 3,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar35 + 0x80),puVar41 + dgd_stride * 4,
                             (__m128i *)local_b0b8,&kl);
              lVar12 = lVar12 + 1;
            }
            local_b1f8 = local_b1f8 + 0x14;
            local_b208 = local_b208 + 0x14;
            puVar38 = puVar38 + lVar11;
            puVar25 = puVar25 + 0xa0;
          }
          iVar8 = iVar8 + (uint)bVar1 + (uint)bVar2;
          puVar37 = puVar37 + 2;
          iVar21 = iVar21 + 2;
        }
        if (3 < iVar7) {
          iVar7 = iVar24;
        }
        if (use_downsampled_wiener_stats != 0) {
          iVar24 = iVar7;
        }
        if ((h_end & 1U) != 0) {
          puVar37 = dgd + (int)lVar17 + lVar22;
          bVar1 = src[(long)(int)lVar17 + (long)iVar27];
          local_b208 = dgd + iVar21 + lVar22;
          puVar25 = local_abb8;
          local_b1f8 = local_b088;
          puVar36 = local_afb8;
          for (lVar22 = 0; lVar22 != 5; lVar22 = lVar22 + 1) {
            lVar17 = 0;
            for (lVar40 = 0; lVar40 != 4000; lVar40 = lVar40 + 800) {
              uVar6 = (ushort)local_b208[lVar17];
              uVar9 = (uint)uVar6;
              *(uint *)(local_b1f8 + lVar17 * 4) = *(int *)(local_b1f8 + lVar17 * 4) + uVar9;
              *(uint *)(puVar36 + lVar17 * 4) =
                   *(int *)(puVar36 + lVar17 * 4) + (uint)uVar6 * (uint)bVar1;
              auVar43 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
              kl = (__m128i)pmovzxbw(auVar43,auVar43);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40),puVar37,(__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40 + 0x20),puVar37 + lVar11,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40 + 0x40),puVar37 + uVar23,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40 + 0x60),puVar37 + dgd_stride * 3,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40 + 0x80),puVar37 + dgd_stride * 4,
                             (__m128i *)local_b0b8,&kl);
              lVar17 = lVar17 + 1;
            }
            puVar36 = puVar36 + 0x14;
            local_b1f8 = local_b1f8 + 0x14;
            local_b208 = local_b208 + lVar11;
            puVar25 = puVar25 + 0xa0;
          }
          iVar8 = iVar8 + (uint)bVar1;
        }
        puVar25 = local_b088;
        piVar15 = sumY[0];
        puVar36 = local_afb8;
        piVar33 = M_int32[0];
        for (lVar22 = 0; lVar22 != 5; lVar22 = lVar22 + 1) {
          for (lVar17 = 0; lVar17 != 5; lVar17 = lVar17 + 1) {
            piVar15[lVar17] = piVar15[lVar17] + *(int *)(puVar25 + lVar17 * 4) * iVar24;
            piVar33[lVar17] = piVar33[lVar17] + *(int *)(puVar36 + lVar17 * 4) * iVar24;
          }
          piVar33 = piVar33 + 5;
          puVar36 = puVar36 + 0x14;
          piVar15 = piVar15 + 5;
          puVar25 = puVar25 + 0x14;
        }
        puVar25 = local_abb8;
        piVar15 = H_int32[0];
        for (lVar22 = 0; lVar22 != 0x19; lVar22 = lVar22 + 1) {
          for (lVar17 = 0; lVar17 != 0x28; lVar17 = lVar17 + 1) {
            piVar15[lVar17] = piVar15[lVar17] + *(int *)(puVar25 + lVar17 * 4) * iVar24;
          }
          piVar15 = piVar15 + 0x28;
          puVar25 = puVar25 + 0xa0;
        }
        iVar29 = iVar29 + iVar8 * iVar24;
        iVar28 = iVar28 + iVar24;
      }
      piVar15 = M_int32[0];
      piVar20 = M_int64[0];
      for (lVar22 = 0; lVar22 != 5; lVar22 = lVar22 + 1) {
        for (lVar17 = 0; lVar17 != 5; lVar17 = lVar17 + 1) {
          piVar20[lVar17] = piVar20[lVar17] + (long)piVar15[lVar17];
          piVar15[lVar17] = 0;
        }
        piVar20 = piVar20 + 5;
        piVar15 = piVar15 + 5;
      }
      piVar15 = H_int32[0];
      piVar20 = H_int64[0];
      for (lVar22 = 0; lVar22 != 0x19; lVar22 = lVar22 + 1) {
        for (lVar17 = 0; lVar17 != 0x28; lVar17 = lVar17 + 1) {
          piVar20[lVar17] = piVar20[lVar17] + (long)piVar15[lVar17];
          piVar15[lVar17] = 0;
        }
        piVar20 = piVar20 + 0x28;
        piVar15 = piVar15 + 0x28;
      }
    }
    uVar23 = (ulong)bVar5;
    lVar11 = uVar23 * uVar23 * (long)((h_end - h_start) * (v_end - v_start));
    piVar20 = H_int64[0];
    for (lVar22 = 0; lVar22 != 5; lVar22 = lVar22 + 1) {
      piVar26 = piVar20;
      piVar34 = local_b148;
      for (lVar17 = 0; lVar17 != 5; lVar17 = lVar17 + 1) {
        iVar24 = sumY[0][lVar22 * 5 + lVar17];
        local_b0a0[lVar17 * 5 + lVar22] =
             (M_int64[0][lVar22 * 5 + lVar17] + lVar11) - ((long)iVar24 + (long)iVar29) * uVar23;
        piVar15 = sumY[0];
        piVar31 = piVar26;
        piVar39 = piVar34;
        for (lVar40 = 0; lVar40 != 5; lVar40 = lVar40 + 1) {
          piVar33 = piVar15;
          for (lVar12 = 0; lVar12 != 0x28; lVar12 = lVar12 + 8) {
            *(ulong *)((long)piVar39 + lVar12) =
                 (piVar31[lVar12] + lVar11) - ((long)*piVar33 + (long)iVar24) * uVar23;
            piVar33 = piVar33 + 5;
          }
          piVar31 = piVar31 + 1;
          piVar39 = piVar39 + 5;
          piVar15 = piVar15 + 1;
        }
        piVar26 = piVar26 + 200;
        piVar34 = piVar34 + 0x7d;
      }
      piVar20 = piVar20 + 0x28;
      local_b148 = local_b148 + 0x19;
    }
  }
  else {
    if (wiener_win != 7) {
      av1_compute_stats_c(wiener_win,dgd,src,dgd_avg,src_avg,h_start,h_end,v_start,v_end,dgd_stride,
                          src_stride,M,H,use_downsampled_wiener_stats);
      return;
    }
    bVar5 = find_average(dgd,h_start,h_end,v_start,v_end,dgd_stride);
    iVar10 = 0;
    memset(M_int32,0,0xc4);
    memset(M_int64,0,0x188);
    memset(H_int32,0,0x2ae0);
    memset(H_int64,0,0x55c0);
    memset(sumY,0,0xc4);
    lVar22 = (long)(dgd_stride * 3);
    local_b090 = dgd + (-3 - lVar22);
    iVar24 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
    local_b0b8[0] = 0x403030202010100;
    local_b0b8[1] = 0x807070606050504;
    local_b098 = dgd + (h_start - lVar22) + -2;
    for (iVar29 = v_start; iVar16 = v_end - iVar29, iVar16 != 0 && iVar29 <= v_end;
        iVar29 = iVar29 + 0x40) {
      if (0x3f < iVar16) {
        iVar16 = 0x40;
      }
      iVar28 = iVar29;
      while( true ) {
        iVar7 = (iVar16 + iVar29) - iVar28;
        if (iVar7 == 0 || iVar16 + iVar29 < iVar28) break;
        iVar8 = 0;
        memset(local_b088,0,0xc4);
        memset(local_afb8,0,0xc4);
        memset(local_abb8,0,0x2ae0);
        puVar37 = local_b090;
        lVar40 = (long)(iVar28 * dgd_stride);
        iVar27 = iVar28 * src_stride;
        puVar41 = local_b098 + lVar40;
        iVar21 = h_start;
        for (lVar17 = (long)h_start; lVar17 < (int)(h_end & 0xfffffffe); lVar17 = lVar17 + 2) {
          puVar38 = puVar37 + lVar17 + lVar40;
          bVar1 = src[lVar17 + iVar27];
          bVar2 = src[lVar17 + (long)iVar27 + 1];
          puVar25 = local_abb8;
          local_b208 = local_b088;
          local_b1f8 = local_afb8;
          puVar42 = puVar41;
          for (lVar12 = 0; lVar12 != 7; lVar12 = lVar12 + 1) {
            lVar35 = 0;
            for (lVar30 = 0; lVar30 != 0x2ae0; lVar30 = lVar30 + 0x620) {
              bVar3 = puVar42[lVar35 + -1];
              bVar4 = puVar42[lVar35];
              *(uint *)(local_b208 + lVar35 * 4) =
                   *(int *)(local_b208 + lVar35 * 4) + (uint)bVar4 + (uint)bVar3;
              *(uint *)(local_b1f8 + lVar35 * 4) =
                   *(int *)(local_b1f8 + lVar35 * 4) +
                   (uint)bVar4 * (uint)bVar2 + (uint)bVar3 * (uint)bVar1;
              auVar43 = pshuflw(ZEXT216(*(ushort *)(puVar42 + lVar35 + -1)),
                                ZEXT216(*(ushort *)(puVar42 + lVar35 + -1)),0);
              kl = (__m128i)pmovzxbw(auVar43,auVar43);
              acc_stat_sse41((int32_t *)(puVar25 + lVar30),puVar38,(__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar30 + 0x20),puVar38 + lVar11,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar30 + 0x40),puVar38 + dgd_stride * 2,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar30 + 0x60),puVar38 + lVar22,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar30 + 0x80),puVar38 + dgd_stride * 4,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar30 + 0xa0),puVar38 + dgd_stride * 5,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar30 + 0xc0),puVar38 + dgd_stride * 6,
                             (__m128i *)local_b0b8,&kl);
              lVar35 = lVar35 + 1;
            }
            local_b1f8 = local_b1f8 + 0x1c;
            local_b208 = local_b208 + 0x1c;
            puVar42 = puVar42 + lVar11;
            puVar25 = puVar25 + 0xe0;
          }
          iVar8 = iVar8 + (uint)bVar1 + (uint)bVar2;
          puVar41 = puVar41 + 2;
          iVar21 = iVar21 + 2;
        }
        if (3 < iVar7) {
          iVar7 = iVar24;
        }
        if (use_downsampled_wiener_stats != 0) {
          iVar24 = iVar7;
        }
        if ((h_end & 1U) != 0) {
          puVar41 = puVar37 + (int)lVar17 + lVar40;
          bVar1 = src[(long)(int)lVar17 + (long)iVar27];
          local_b208 = puVar37 + iVar21 + lVar40;
          puVar25 = local_abb8;
          local_b1f8 = local_b088;
          puVar36 = local_afb8;
          for (lVar17 = 0; lVar17 != 7; lVar17 = lVar17 + 1) {
            lVar12 = 0;
            for (lVar40 = 0; lVar40 != 0x2ae0; lVar40 = lVar40 + 0x620) {
              uVar6 = (ushort)local_b208[lVar12];
              uVar9 = (uint)uVar6;
              *(uint *)(local_b1f8 + lVar12 * 4) = *(int *)(local_b1f8 + lVar12 * 4) + uVar9;
              *(uint *)(puVar36 + lVar12 * 4) =
                   *(int *)(puVar36 + lVar12 * 4) + (uint)uVar6 * (uint)bVar1;
              auVar43 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
              kl = (__m128i)pmovzxbw(auVar43,auVar43);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40),puVar41,(__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40 + 0x20),puVar41 + lVar11,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40 + 0x40),puVar41 + dgd_stride * 2,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40 + 0x60),puVar41 + lVar22,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40 + 0x80),puVar41 + dgd_stride * 4,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40 + 0xa0),puVar41 + dgd_stride * 5,
                             (__m128i *)local_b0b8,&kl);
              acc_stat_sse41((int32_t *)(puVar25 + lVar40 + 0xc0),puVar41 + dgd_stride * 6,
                             (__m128i *)local_b0b8,&kl);
              lVar12 = lVar12 + 1;
            }
            puVar36 = puVar36 + 0x1c;
            local_b1f8 = local_b1f8 + 0x1c;
            local_b208 = local_b208 + lVar11;
            puVar25 = puVar25 + 0xe0;
          }
          iVar8 = iVar8 + (uint)bVar1;
        }
        puVar25 = local_b088;
        paiVar13 = sumY;
        puVar36 = local_afb8;
        paiVar32 = M_int32;
        for (lVar17 = 0; lVar17 != 7; lVar17 = lVar17 + 1) {
          for (lVar40 = 0; lVar40 != 7; lVar40 = lVar40 + 1) {
            (*paiVar13)[lVar40] = (*paiVar13)[lVar40] + *(int *)(puVar25 + lVar40 * 4) * iVar24;
            (*paiVar32)[lVar40] = (*paiVar32)[lVar40] + *(int *)(puVar36 + lVar40 * 4) * iVar24;
          }
          paiVar32 = paiVar32 + 1;
          puVar36 = puVar36 + 0x1c;
          paiVar13 = paiVar13 + 1;
          puVar25 = puVar25 + 0x1c;
        }
        puVar25 = local_abb8;
        paiVar14 = H_int32;
        for (lVar17 = 0; lVar17 != 0x31; lVar17 = lVar17 + 1) {
          for (lVar40 = 0; lVar40 != 0x38; lVar40 = lVar40 + 1) {
            (*paiVar14)[lVar40] = (*paiVar14)[lVar40] + *(int *)(puVar25 + lVar40 * 4) * iVar24;
          }
          paiVar14 = paiVar14 + 1;
          puVar25 = puVar25 + 0xe0;
        }
        iVar10 = iVar10 + iVar8 * iVar24;
        iVar28 = iVar28 + iVar24;
      }
      paiVar13 = M_int32;
      paiVar18 = M_int64;
      for (lVar17 = 0; lVar17 != 7; lVar17 = lVar17 + 1) {
        for (lVar40 = 0; lVar40 != 7; lVar40 = lVar40 + 1) {
          (*paiVar18)[lVar40] = (*paiVar18)[lVar40] + (long)(*paiVar13)[lVar40];
          (*paiVar13)[lVar40] = 0;
        }
        paiVar18 = paiVar18 + 1;
        paiVar13 = paiVar13 + 1;
      }
      paiVar14 = H_int32;
      paiVar19 = H_int64;
      for (lVar17 = 0; lVar17 != 0x31; lVar17 = lVar17 + 1) {
        for (lVar40 = 0; lVar40 != 0x38; lVar40 = lVar40 + 1) {
          (*paiVar19)[lVar40] = (*paiVar19)[lVar40] + (long)(*paiVar14)[lVar40];
          (*paiVar14)[lVar40] = 0;
        }
        paiVar19 = paiVar19 + 1;
        paiVar14 = paiVar14 + 1;
      }
    }
    uVar23 = (ulong)bVar5;
    lVar11 = uVar23 * uVar23 * (long)((h_end - h_start) * (v_end - v_start));
    piVar20 = H_int64[0];
    for (lVar22 = 0; lVar22 != 7; lVar22 = lVar22 + 1) {
      piVar26 = piVar20;
      piVar34 = local_b148;
      for (lVar17 = 0; lVar17 != 7; lVar17 = lVar17 + 1) {
        iVar24 = sumY[lVar22][lVar17];
        local_b0a0[lVar17 * 7 + lVar22] =
             (M_int64[lVar22][lVar17] + lVar11) - ((long)iVar24 + (long)iVar10) * uVar23;
        piVar15 = sumY[0];
        piVar31 = piVar26;
        piVar39 = piVar34;
        for (lVar40 = 0; lVar40 != 7; lVar40 = lVar40 + 1) {
          piVar33 = piVar15;
          for (lVar12 = 0; lVar12 != 0x38; lVar12 = lVar12 + 8) {
            *(ulong *)((long)piVar39 + lVar12) =
                 (piVar31[lVar12] + lVar11) - ((long)*piVar33 + (long)iVar24) * uVar23;
            piVar33 = piVar33 + 7;
          }
          piVar31 = piVar31 + 1;
          piVar39 = piVar39 + 7;
          piVar15 = piVar15 + 1;
        }
        piVar26 = piVar26 + 0x188;
        piVar34 = piVar34 + 0x157;
      }
      piVar20 = piVar20 + 0x38;
      local_b148 = local_b148 + 0x31;
    }
  }
  return;
}

Assistant:

void av1_compute_stats_sse4_1(int wiener_win, const uint8_t *dgd,
                              const uint8_t *src, int16_t *dgd_avg,
                              int16_t *src_avg, int h_start, int h_end,
                              int v_start, int v_end, int dgd_stride,
                              int src_stride, int64_t *M, int64_t *H,
                              int use_downsampled_wiener_stats) {
  if (wiener_win == WIENER_WIN) {
    compute_stats_win7_opt_sse4_1(dgd, src, h_start, h_end, v_start, v_end,
                                  dgd_stride, src_stride, M, H,
                                  use_downsampled_wiener_stats);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    compute_stats_win5_opt_sse4_1(dgd, src, h_start, h_end, v_start, v_end,
                                  dgd_stride, src_stride, M, H,
                                  use_downsampled_wiener_stats);
  } else {
    av1_compute_stats_c(wiener_win, dgd, src, dgd_avg, src_avg, h_start, h_end,
                        v_start, v_end, dgd_stride, src_stride, M, H,
                        use_downsampled_wiener_stats);
  }
}